

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O1

void __thiscall test_b_tree::test_search_non_existent_keys(test_b_tree *this)

{
  runtime_error *this_00;
  pointer plVar1;
  initializer_list<long> __l;
  optional<long> oVar2;
  vector<long,_std::allocator<long>_> non_existent_keys;
  b_tree t;
  allocator_type local_b9;
  string local_b8;
  vector<long,_std::allocator<long>_> local_90;
  b_tree local_78;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"test.db","");
  b_tree::b_tree(&local_78,&local_b8,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8.field_2._M_allocated_capacity = 200;
  local_b8.field_2._8_8_ = 500;
  local_b8._M_dataplus._M_p = (pointer)0xfffffffffffffff6;
  local_b8._M_string_length = 0xfffffffffffffffb;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  std::vector<long,_std::allocator<long>_>::vector(&local_90,__l,&local_b9);
  if (local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    plVar1 = local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      oVar2 = b_tree::search(&local_78,*plVar1);
      if (((undefined1  [16])
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        rtf_format_abi_cxx11_
                  (&local_b8,"%s at Line:%d File:%s","!t.search(k)",0xc4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                  );
        std::runtime_error::runtime_error(this_00,(string *)&local_b8);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      plVar1 = plVar1 + 1;
    } while (plVar1 != local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (int64_t *)0x0) {
    operator_delete(local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pager::~pager(&local_78._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}